

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystemTests.cpp
# Opt level: O2

void __thiscall
solitaire::graphics::SDLGraphicsSystemTests::
expectThrowIfSDLCreateRendererFailedDuringWindowCreation(SDLGraphicsSystemTests *this)

{
  WrapperMock *this_00;
  PtrDeleterMock *this_01;
  bool bVar1;
  TypedExpectation<int_(unsigned_int)> *this_02;
  TypedExpectation<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
  *this_03;
  TypedExpectation<std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_(const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&,_int,_unsigned_int)>
  *this_04;
  unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_> *x;
  char *this_05;
  undefined1 local_d0 [16];
  undefined1 local_c0 [16];
  undefined1 local_b0 [32];
  MatcherBase<unsigned_int> local_90;
  ReturnAction<int> local_78;
  unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_> local_68;
  unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_> local_40;
  
  this_00 = &((this->sdlMock).rawPointer)->super_WrapperMock;
  testing::Matcher<unsigned_int>::Matcher((Matcher<unsigned_int> *)&local_90,0x20);
  SDL::WrapperMock::gmock_init
            ((MockSpec<int_(unsigned_int)> *)local_d0,this_00,(Matcher<unsigned_int> *)&local_90);
  testing::internal::GetWithoutMatchers();
  this_02 = testing::internal::MockSpec<int_(unsigned_int)>::InternalExpectedAt
                      ((MockSpec<int_(unsigned_int)> *)local_d0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
                       ,0x5a,"*sdlMock","init(0x00000020u)");
  testing::internal::ReturnAction<int>::ReturnAction(&local_78,0);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<int_(unsigned_int)> *)local_b0,(ReturnAction *)&local_78);
  testing::internal::TypedExpectation<int_(unsigned_int)>::WillOnce
            (this_02,(Action<int_(unsigned_int)> *)local_b0);
  std::_Function_base::~_Function_base((_Function_base *)local_b0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_78.value_.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::MatcherBase<unsigned_int>::~MatcherBase
            ((MatcherBase<unsigned_int> *)(local_d0 + 8));
  testing::internal::MatcherBase<unsigned_int>::~MatcherBase(&local_90);
  this_03 = expectSDLCreateWindow
                      (this,(string *)(anonymous_namespace)::title_abi_cxx11_,0x280,0x348);
  makeSDLWindow((UniquePtr<SDL_Window> *)&local_40,this,(SDL_Window_conflict *)0x1);
  testing::ByMove<std::unique_ptr<SDL_Window,std::function<void(SDL_Window*)>>>
            ((ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_> *)
             &local_68,(testing *)&local_40,x);
  testing::
  Return<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Window,std::function<void(SDL_Window*)>>>>
            ((testing *)local_b0,
             (ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_> *)
             &local_68);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
              *)local_d0,(ReturnAction *)local_b0);
  testing::internal::
  TypedExpectation<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
  ::WillOnce(this_03,(Action<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
                      *)local_d0);
  std::_Function_base::~_Function_base((_Function_base *)local_d0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b0 + 8));
  std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>::~unique_ptr(&local_68);
  std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>::~unique_ptr(&local_40);
  this_04 = expectSDLCreateRenderer(this,(SDL_Window_conflict *)0x1);
  testing::PolymorphicAction::operator_cast_to_Action
            ((Action<std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_(const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&,_int,_unsigned_int)>
              *)local_d0,(PolymorphicAction *)local_b0);
  testing::internal::
  TypedExpectation<std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_(const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&,_int,_unsigned_int)>
  ::WillOnce(this_04,(Action<std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_(const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&,_int,_unsigned_int)>
                      *)local_d0);
  std::_Function_base::~_Function_base((_Function_base *)local_d0);
  this_01 = &((this->ptrDeleterMock).
              super___shared_ptr<testing::StrictMock<solitaire::SDL::PtrDeleterMock>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->super_PtrDeleterMock;
  testing::Matcher<SDL_Window_*>::Matcher((Matcher<SDL_Window_*> *)local_b0,(Snapshot *)0x1);
  SDL::PtrDeleterMock::gmock_windowDeleter
            ((MockSpec<void_(SDL_Window_*)> *)local_d0,this_01,(Matcher<SDL_Window_*> *)local_b0);
  testing::internal::GetWithoutMatchers();
  this_05 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
  ;
  testing::internal::MockSpec<void_(SDL_Window_*)>::InternalExpectedAt
            ((MockSpec<void_(SDL_Window_*)> *)local_d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
             ,0x5e,"*ptrDeleterMock","windowDeleter(windowPtr)");
  testing::internal::MatcherBase<SDL_Window_*>::~MatcherBase
            ((MatcherBase<SDL_Window_*> *)(local_d0 + 8));
  testing::internal::MatcherBase<SDL_Window_*>::~MatcherBase((MatcherBase<SDL_Window_*> *)local_b0);
  local_d0._0_8_ =
       SDL::WrapperMock::gmock_quit
                 ((MockSpec<void_()> *)(this->sdlMock).rawPointer,(WrapperMock *)this_05);
  testing::internal::GetWithoutMatchers();
  testing::internal::MockSpec<void_()>::InternalExpectedAt
            ((MockSpec<void_()> *)local_d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
             ,0x5f,"*sdlMock","quit()");
  local_d0._0_8_ = local_c0;
  local_c0._0_8_ = (VTable *)0x0;
  local_c0._8_8_ = (void *)0x0;
  local_d0._8_8_ = (_func_int **)0x0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    SDLGraphicsSystem::createWindow
              (&this->system,(string *)(anonymous_namespace)::title_abi_cxx11_,0x280,0x348);
  }
  std::__cxx11::string::assign(local_d0);
  testing::Message::Message((Message *)local_b0);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_90,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
             ,100,(char *)local_d0._0_8_);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)local_b0);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
  if ((long *)local_b0._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_b0._0_8_ + 8))();
  }
  std::__cxx11::string::~string((string *)local_d0);
  return;
}

Assistant:

void expectThrowIfSDLCreateRendererFailedDuringWindowCreation() {
        EXPECT_CALL(*sdlMock, init(SDL_INIT_VIDEO)).WillOnce(Return(success));
        expectSDLCreateWindow(title, windowWidth, windowHeight)
            .WillOnce(Return(ByMove(makeSDLWindow(windowPtr))));
        expectSDLCreateRenderer(windowPtr).WillOnce(ReturnNull());
        EXPECT_CALL(*ptrDeleterMock, windowDeleter(windowPtr));
        EXPECT_CALL(*sdlMock, quit());

        EXPECT_THROW(
            system.createWindow(title, windowWidth, windowHeight),
            std::runtime_error
        );
    }